

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O3

Query * queryparse::transform(Query *__return_storage_ptr__,node *n)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  undefined8 __nptr;
  int *piVar4;
  runtime_error *this;
  pointer puVar5;
  type_info *ptVar6;
  vector<Query,_std::allocator<Query>_> local_a8;
  undefined1 local_88 [48];
  vector<Query,_std::allocator<Query>_> local_58;
  long local_40;
  Query *local_38;
  
  ptVar6 = (n->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content.id_;
  if (((ptVar6 != (type_info *)&hexstring::typeinfo) &&
      (ptVar6 != (type_info *)&plaintext::typeinfo)) &&
     (ptVar6 != (type_info *)&wide_plaintext::typeinfo)) {
    do {
      if (ptVar6 == (type_info *)&min_of_expr::typeinfo) {
        lVar3 = *(long *)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                         super_default_node_children<tao::pegtl::parse_tree::node>.children.
                         super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        local_88._0_8_ = local_88 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,*(undefined8 *)(lVar3 + 0x20),*(undefined8 *)(lVar3 + 0x40));
        __nptr = local_88._0_8_;
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        *piVar4 = 0;
        local_40 = strtol((char *)__nptr,(char **)&local_a8,10);
        if (local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)__nptr) {
          std::__throw_invalid_argument("stoi");
        }
        else if (((int)local_40 == local_40) && (*piVar4 != 0x22)) {
          if (*piVar4 == 0) {
            *piVar4 = iVar1;
          }
          local_38 = __return_storage_ptr__;
          if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
            operator_delete((void *)local_88._0_8_,
                            (ulong)((long)&(((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)local_88._16_8_)->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          puVar5 = (pointer)((long)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                                   super_default_node_children<tao::pegtl::parse_tree::node>.
                                   children.
                                   super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 8);
          if (puVar5 != (n->super_basic_node<tao::pegtl::parse_tree::node>).
                        super_default_node_children<tao::pegtl::parse_tree::node>.children.
                        super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              transform((Query *)local_88,
                        (puVar5->_M_t).
                        super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
                        .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl);
              std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                        (&local_a8,(Query *)local_88);
              std::vector<Query,_std::allocator<Query>_>::~vector(&local_58);
              std::vector<QToken,_std::allocator<QToken>_>::~vector
                        ((vector<QToken,_std::allocator<QToken>_> *)(local_88 + 8));
              puVar5 = puVar5 + 1;
            } while (puVar5 != (n->super_basic_node<tao::pegtl::parse_tree::node>).
                               super_default_node_children<tao::pegtl::parse_tree::node>.children.
                               super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          __return_storage_ptr__ = local_38;
          Query::Query(local_38,(uint32_t)local_40,&local_a8);
LAB_00157ab7:
          std::vector<Query,_std::allocator<Query>_>::~vector(&local_a8);
          return __return_storage_ptr__;
        }
        std::__throw_out_of_range("stoi");
LAB_00157b1b:
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"encountered unexpected expression");
LAB_00157aed:
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (ptVar6 != (type_info *)&expression::typeinfo) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"encountered unexpected node");
        goto LAB_00157aed;
      }
      plVar2 = (long *)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                       super_default_node_children<tao::pegtl::parse_tree::node>.children.
                       super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      if ((long)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                super_default_node_children<tao::pegtl::parse_tree::node>.children.
                super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)plVar2 != 8) {
        if (*(pointer_____offset_0x10___ **)(plVar2[1] + 0x18) == &op_or::typeinfo) {
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          transform((Query *)local_88,(node *)*plVar2);
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                    (&local_a8,(Query *)local_88);
          std::vector<Query,_std::allocator<Query>_>::~vector(&local_58);
          std::vector<QToken,_std::allocator<QToken>_>::~vector
                    ((vector<QToken,_std::allocator<QToken>_> *)(local_88 + 8));
          transform((Query *)local_88,
                    *(node **)((long)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                                     super_default_node_children<tao::pegtl::parse_tree::node>.
                                     children.
                                     super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x10));
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                    (&local_a8,(Query *)local_88);
          std::vector<Query,_std::allocator<Query>_>::~vector(&local_58);
          std::vector<QToken,_std::allocator<QToken>_>::~vector
                    ((vector<QToken,_std::allocator<QToken>_> *)(local_88 + 8));
          local_88._0_4_ = 3;
          Query::Query(__return_storage_ptr__,(QueryType *)local_88,&local_a8);
        }
        else {
          if (*(pointer_____offset_0x10___ **)(plVar2[1] + 0x18) != &op_and::typeinfo)
          goto LAB_00157b1b;
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          local_a8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          transform((Query *)local_88,(node *)*plVar2);
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                    (&local_a8,(Query *)local_88);
          std::vector<Query,_std::allocator<Query>_>::~vector(&local_58);
          std::vector<QToken,_std::allocator<QToken>_>::~vector
                    ((vector<QToken,_std::allocator<QToken>_> *)(local_88 + 8));
          transform((Query *)local_88,
                    *(node **)((long)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                                     super_default_node_children<tao::pegtl::parse_tree::node>.
                                     children.
                                     super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x10));
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                    (&local_a8,(Query *)local_88);
          std::vector<Query,_std::allocator<Query>_>::~vector(&local_58);
          std::vector<QToken,_std::allocator<QToken>_>::~vector
                    ((vector<QToken,_std::allocator<QToken>_> *)(local_88 + 8));
          local_88._0_4_ = 2;
          Query::Query(__return_storage_ptr__,(QueryType *)local_88,&local_a8);
        }
        goto LAB_00157ab7;
      }
      n = (node *)*plVar2;
      ptVar6 = (n->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content.id_;
    } while (((ptVar6 != (type_info *)&hexstring::typeinfo) &&
             (ptVar6 != (type_info *)&plaintext::typeinfo)) &&
            (ptVar6 != (type_info *)&wide_plaintext::typeinfo));
  }
  transform_qstring((QString *)local_88,n);
  Query::Query(__return_storage_ptr__,(QString *)local_88);
  std::vector<QToken,_std::allocator<QToken>_>::~vector
            ((vector<QToken,_std::allocator<QToken>_> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Query transform(const parse_tree::node &n) {
    if (n.is<plaintext>() || n.is<wide_plaintext>() || n.is<hexstring>()) {
        return Query(transform_qstring(n));
    }
    if (n.is<min_of_expr>()) {
        auto &count = n.children[0];
        uint32_t counti;

        try {
            counti = std::stoi(count->content());
        } catch (std::out_of_range &e) {
            throw std::runtime_error(
                "number N is out of range in 'min N of (...)' expression");
        }

        auto it = n.children.cbegin() + 1;
        std::vector<Query> subq;
        for (; it != n.children.cend(); ++it) {
            subq.emplace_back(transform(**it));
        }

        return Query(counti, std::move(subq));
    }
    if (n.is<expression>()) {
        if (n.children.size() == 1) {
            return transform(*n.children[0]);
        }

        auto &expr = n.children[1];
        if (expr->is<op_or>()) {
            std::vector<Query> opts;
            opts.emplace_back(transform(*n.children[0]));
            opts.emplace_back(transform(*n.children[2]));
            return Query(QueryType::OR, std::move(opts));
        }
        if (expr->is<op_and>()) {
            std::vector<Query> opts;
            opts.emplace_back(transform(*n.children[0]));
            opts.emplace_back(transform(*n.children[2]));
            return Query(QueryType::AND, std::move(opts));
        }
        throw std::runtime_error("encountered unexpected expression");
    }
    throw std::runtime_error("encountered unexpected node");
}